

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O3

void Eigen::internal::init_scoring<int>
               (int n_row,int n_col,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,int *head,
               double *knobs,int *p_n_row2,int *p_n_col2,int *p_max_deg)

{
  int *piVar1;
  bool bVar2;
  ulong uVar3;
  anon_union_4_2_db423fdf_for_shared4 *paVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  colamd_col<int> *pcVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar16 = (double)n_col;
  dVar15 = *knobs * dVar16;
  uVar14 = (ulong)(n_col - 1);
  iVar13 = n_col;
  if (0 < n_col) {
    dVar18 = (double)n_row;
    dVar19 = knobs[1] * dVar18;
    dVar17 = 0.0;
    if (0.0 <= dVar19) {
      dVar17 = dVar19;
    }
    pcVar8 = Col + uVar14;
    lVar9 = uVar14 + 1;
    do {
      if (pcVar8->length == 0) {
        iVar13 = iVar13 + -1;
        (pcVar8->shared2).score = iVar13;
        pcVar8->start = -1;
      }
      pcVar8 = pcVar8 + -1;
      lVar5 = lVar9 + -1;
      bVar2 = 0 < lVar9;
      lVar9 = lVar5;
    } while (lVar5 != 0 && bVar2);
    uVar3 = uVar14;
    if (0 < n_col) {
      do {
        if (-1 < (long)Col[uVar3].start) {
          pcVar8 = Col + uVar3;
          iVar6 = pcVar8->length;
          if ((int)(double)(~-(ulong)(dVar19 < dVar18) & (ulong)dVar18 |
                           (ulong)dVar17 & -(ulong)(dVar19 < dVar18)) < iVar6) {
            iVar13 = iVar13 + -1;
            (pcVar8->shared2).score = iVar13;
            if (0 < iVar6) {
              piVar10 = A + Col[uVar3].start;
              piVar1 = piVar10 + iVar6;
              do {
                iVar6 = *piVar10;
                piVar10 = piVar10 + 1;
                Row[iVar6].shared1.degree = Row[iVar6].shared1.degree + -1;
              } while (piVar10 < piVar1);
            }
            pcVar8->start = -1;
          }
        }
        bVar2 = 0 < (long)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar2);
    }
  }
  if (n_row < 1) {
    iVar6 = 0;
  }
  else {
    dVar17 = 0.0;
    if (0.0 <= dVar15) {
      dVar17 = dVar15;
    }
    uVar3 = (ulong)(uint)n_row;
    lVar9 = 0;
    iVar6 = 0;
    do {
      iVar11 = *(int *)((long)&Row->shared1 + lVar9);
      if ((int)(double)(~-(ulong)(dVar15 < dVar16) & (ulong)dVar16 |
                       (ulong)dVar17 & -(ulong)(dVar15 < dVar16)) < iVar11 || iVar11 == 0) {
        *(undefined4 *)((long)&Row->shared2 + lVar9) = 0xffffffff;
        n_row = n_row + -1;
      }
      else if (iVar6 <= iVar11) {
        iVar6 = iVar11;
      }
      lVar9 = lVar9 + 0x10;
    } while (uVar3 << 4 != lVar9);
  }
  uVar3 = uVar14;
  if (n_col < 1) {
    if (-1 < n_col) {
      memset(head,0xff,(ulong)(uint)n_col * 4 + 4);
    }
  }
  else {
    do {
      if (-1 < (long)Col[uVar3].start) {
        pcVar8 = Col + uVar3;
        piVar10 = A + Col[uVar3].start;
        piVar1 = piVar10 + pcVar8->length;
        piVar12 = piVar10;
        iVar11 = 0;
        while (piVar12 < piVar1) {
          iVar7 = *piVar12;
          piVar12 = piVar12 + 1;
          if (-1 < Row[iVar7].shared2.mark) {
            *piVar10 = iVar7;
            piVar10 = piVar10 + 1;
            iVar11 = iVar11 + Row[iVar7].shared1.degree + -1;
            if (n_col <= iVar11) {
              iVar11 = n_col;
            }
          }
        }
        iVar7 = (int)((ulong)((long)piVar10 - (long)(A + (uint)pcVar8->start)) >> 2);
        if (iVar7 == 0) {
          iVar13 = iVar13 + -1;
          (pcVar8->shared2).score = iVar13;
          pcVar8->start = -1;
        }
        else {
          pcVar8->length = iVar7;
          (pcVar8->shared2).score = iVar11;
        }
      }
      bVar2 = 0 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    memset(head,0xff,(ulong)(uint)n_col * 4 + 4);
    if (0 < n_col) {
      paVar4 = &Col[uVar14].shared4;
      do {
        if (-1 < ((colamd_col<int> *)(paVar4 + -5))->start) {
          iVar11 = ((anon_union_4_2_0da084e5_for_shared2 *)(paVar4 + -2))->score;
          iVar7 = head[iVar11];
          ((anon_union_4_3_eabe2f71_for_shared3 *)(paVar4 + -1))->headhash = -1;
          paVar4->degree_next = iVar7;
          if ((long)iVar7 != -1) {
            Col[iVar7].shared3.headhash = (int)uVar14;
          }
          head[iVar11] = (int)uVar14;
        }
        paVar4 = paVar4 + -6;
        bVar2 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar2);
    }
  }
  *p_n_col2 = iVar13;
  *p_n_row2 = n_row;
  *p_max_deg = iVar6;
  return;
}

Assistant:

static void init_scoring
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    double knobs [COLAMD_KNOBS],/* parameters */
    Index *p_n_row2,    /* number of non-dense, non-empty rows */
    Index *p_n_col2,    /* number of non-dense, non-empty columns */
    Index *p_max_deg    /* maximum row degree */
    )
{
  /* === Local variables ================================================== */

  Index c ;     /* a column index */
  Index r, row ;    /* a row index */
  Index *cp ;     /* a column pointer */
  Index deg ;     /* degree of a row or column */
  Index *cp_end ;   /* a pointer to the end of a column */
  Index *new_cp ;   /* new column pointer */
  Index col_length ;    /* length of pruned column */
  Index score ;     /* current column score */
  Index n_col2 ;    /* number of non-dense, non-empty columns */
  Index n_row2 ;    /* number of non-dense, non-empty rows */
  Index dense_row_count ; /* remove rows with more entries than this */
  Index dense_col_count ; /* remove cols with more entries than this */
  Index min_score ;   /* smallest column score */
  Index max_deg ;   /* maximum row degree */
  Index next_col ;    /* Used to add to degree list.*/


  /* === Extract knobs ==================================================== */

  dense_row_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_ROW] * n_col, n_col)) ;
  dense_col_count = COLAMD_MAX (0, COLAMD_MIN (knobs [COLAMD_DENSE_COL] * n_row, n_row)) ;
  COLAMD_DEBUG1 (("colamd: densecount: %d %d\n", dense_row_count, dense_col_count)) ;
  max_deg = 0 ;
  n_col2 = n_col ;
  n_row2 = n_row ;

  /* === Kill empty columns =============================================== */

  /* Put the empty columns at the end in their natural order, so that LU */
  /* factorization can proceed as far as possible. */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    deg = Col [c].length ;
    if (deg == 0)
    {
      /* this is a empty column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense columns =============================================== */

  /* Put the dense columns at the end, in their natural order */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip any dead columns */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    deg = Col [c].length ;
    if (deg > dense_col_count)
    {
      /* this is a dense column, kill and order it last */
      Col [c].shared2.order = --n_col2 ;
      /* decrement the row degrees */
      cp = &A [Col [c].start] ;
      cp_end = cp + Col [c].length ;
      while (cp < cp_end)
      {
	Row [*cp++].shared1.degree-- ;
      }
      KILL_PRINCIPAL_COL (c) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null columns killed: %d\n", n_col - n_col2)) ;

  /* === Kill dense and empty rows ======================================== */

  for (r = 0 ; r < n_row ; r++)
  {
    deg = Row [r].shared1.degree ;
    COLAMD_ASSERT (deg >= 0 && deg <= n_col) ;
    if (deg > dense_row_count || deg == 0)
    {
      /* kill a dense or empty row */
      KILL_ROW (r) ;
      --n_row2 ;
    }
    else
    {
      /* keep track of max degree of remaining rows */
      max_deg = COLAMD_MAX (max_deg, deg) ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense and null rows killed: %d\n", n_row - n_row2)) ;

  /* === Compute initial column scores ==================================== */

  /* At this point the row degrees are accurate.  They reflect the number */
  /* of "live" (non-dense) columns in each row.  No empty rows exist. */
  /* Some "live" columns may contain only dead rows, however.  These are */
  /* pruned in the code below. */

  /* now find the initial matlab score for each column */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* skip dead column */
    if (COL_IS_DEAD (c))
    {
      continue ;
    }
    score = 0 ;
    cp = &A [Col [c].start] ;
    new_cp = cp ;
    cp_end = cp + Col [c].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      /* skip if dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      /* compact the column */
      *new_cp++ = row ;
      /* add row's external degree */
      score += Row [row].shared1.degree - 1 ;
      /* guard against integer overflow */
      score = COLAMD_MIN (score, n_col) ;
    }
    /* determine pruned column length */
    col_length = (Index) (new_cp - &A [Col [c].start]) ;
    if (col_length == 0)
    {
      /* a newly-made null column (all rows in this col are "dense" */
      /* and have already been killed) */
      COLAMD_DEBUG2 (("Newly null killed: %d\n", c)) ;
      Col [c].shared2.order = --n_col2 ;
      KILL_PRINCIPAL_COL (c) ;
    }
    else
    {
      /* set column length and set score */
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      Col [c].length = col_length ;
      Col [c].shared2.score = score ;
    }
  }
  COLAMD_DEBUG1 (("colamd: Dense, null, and newly-null columns killed: %d\n",
		  n_col-n_col2)) ;

  /* At this point, all empty rows and columns are dead.  All live columns */
  /* are "clean" (containing no dead rows) and simplicial (no supercolumns */
  /* yet).  Rows may contain dead columns, but all live rows contain at */
  /* least one live column. */

  /* === Initialize degree lists ========================================== */


  /* clear the hash buckets */
  for (c = 0 ; c <= n_col ; c++)
  {
    head [c] = COLAMD_EMPTY ;
  }
  min_score = n_col ;
  /* place in reverse order, so low column indices are at the front */
  /* of the lists.  This is to encourage natural tie-breaking */
  for (c = n_col-1 ; c >= 0 ; c--)
  {
    /* only add principal columns to degree lists */
    if (COL_IS_ALIVE (c))
    {
      COLAMD_DEBUG4 (("place %d score %d minscore %d ncol %d\n",
		      c, Col [c].shared2.score, min_score, n_col)) ;

      /* === Add columns score to DList =============================== */

      score = Col [c].shared2.score ;

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (score >= 0) ;
      COLAMD_ASSERT (score <= n_col) ;
      COLAMD_ASSERT (head [score] >= COLAMD_EMPTY) ;

      /* now add this column to dList at proper score location */
      next_col = head [score] ;
      Col [c].shared3.prev = COLAMD_EMPTY ;
      Col [c].shared4.degree_next = next_col ;

      /* if there already was a column with the same score, set its */
      /* previous pointer to this new column */
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = c ;
      }
      head [score] = c ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, score) ;


    }
  }


  /* === Return number of remaining columns, and max row degree =========== */

  *p_n_col2 = n_col2 ;
  *p_n_row2 = n_row2 ;
  *p_max_deg = max_deg ;
}